

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,size_t _elemsize,int _packing,Allocator *_allocator)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  
  if ((((this->dims != 2) || (this->w != _w)) || (this->h != _h)) ||
     (((this->elemsize != _elemsize || (this->packing != _packing)) ||
      (this->allocator != _allocator)))) {
    release(this);
    this->elemsize = _elemsize;
    this->packing = _packing;
    this->allocator = _allocator;
    this->dims = 2;
    this->w = _w;
    this->h = _h;
    this->c = 1;
    iVar2 = _h * _w;
    this->cstep = (long)iVar2;
    if (iVar2 != 0) {
      uVar3 = (long)iVar2 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar1 = ncnn::fastMalloc(uVar3 + 4);
      }
      else {
        pvVar1 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator);
      }
      this->data = pvVar1;
      this->refcount = (int *)((long)pvVar1 + uVar3);
      *(undefined4 *)((long)pvVar1 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, size_t _elemsize, int _packing, Allocator* _allocator)
{
    if (dims == 2 && w == _w && h == _h && elemsize == _elemsize && packing == _packing && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    packing = _packing;
    allocator = _allocator;

    dims = 2;
    w = _w;
    h = _h;
    c = 1;

    cstep = w * h;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}